

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapNoise(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar3 == 0) {
    uVar5 = 299999;
    if (l->mc < '\n') {
      uVar5 = 2;
    }
    if (0 < h) {
      uVar1 = l->startSeed;
      lVar8 = 0;
      do {
        if (0 < w) {
          lVar9 = (long)(z + (int)lVar8);
          lVar7 = 0;
          do {
            if (out[lVar7] < 1) {
              iVar3 = 0;
            }
            else {
              lVar4 = (long)((int)lVar7 + x);
              lVar6 = uVar1 + lVar4;
              lVar6 = (lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar6 + lVar9;
              lVar4 = (lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar6 + lVar4;
              lVar6 = (lVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar4 + lVar9;
              auVar2._8_8_ = lVar6 >> 0x3f;
              auVar2._0_8_ = lVar6 >> 0x18;
              iVar3 = (SUB164(auVar2 % SEXT816((long)(ulong)uVar5),4) >> 0x1f & uVar5) +
                      SUB164(auVar2 % SEXT816((long)(ulong)uVar5),0) + 2;
            }
            out[lVar7] = iVar3;
            lVar7 = lVar7 + 1;
          } while (w != lVar7);
        }
        lVar8 = lVar8 + 1;
        out = out + w;
      } while (lVar8 != h);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapNoise(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    int mod = (l->mc <= MC_1_6) ? 2 : 299999;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            if (out[i + j*w] > 0)
            {
                cs = getChunkSeed(ss, i + x, j + z);
                out[i + j*w] = mcFirstInt(cs, mod)+2;
            }
            else
            {
                out[i + j*w] = 0;
            }
        }
    }

    return 0;
}